

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::SubroutinesBase::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 430                         \nin vec4 position;                    \nsubroutine vec4 a_t();               \nsubroutine uniform a_t a;            \nsubroutine(a_t) vec4 x() {           \n   return vec4(1);                   \n}                                    \nsubroutine(a_t) vec4 y() {           \n   return vec4(0);                   \n}                                    \nvoid main(void)                      \n{                                    \n   gl_Position = a();                \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 430                         \n"
			   "in vec4 position;                    \n"
			   ""
			   "subroutine vec4 a_t();               \n"
			   "subroutine uniform a_t a;            \n"
			   "subroutine(a_t) vec4 x() {           \n"
			   "   return vec4(1);                   \n"
			   "}                                    \n"
			   "subroutine(a_t) vec4 y() {           \n"
			   "   return vec4(0);                   \n"
			   "}                                    \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "   gl_Position = a();                \n"
			   "}";
	}